

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall
CGraphics_Threaded::SetColor(CGraphics_Threaded *this,float r,float g,float b,float a)

{
  long lVar1;
  long in_FS_OFFSET;
  CColorVertex Array [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0x222,(uint)(this->m_Drawing != 0),"called Graphics()->SetColor without begin");
  Array[0].m_Index = 0;
  Array[1].m_Index = 1;
  Array[2].m_Index = 2;
  Array[3].m_Index = 3;
  Array[0].m_R = r;
  Array[0].m_G = g;
  Array[0].m_B = b;
  Array[0].m_A = a;
  Array[1].m_R = r;
  Array[1].m_G = g;
  Array[1].m_B = b;
  Array[1].m_A = a;
  Array[2].m_R = r;
  Array[2].m_G = g;
  Array[2].m_B = b;
  Array[2].m_A = a;
  Array[3].m_R = r;
  Array[3].m_G = g;
  Array[3].m_B = b;
  Array[3].m_A = a;
  (**(code **)(*(long *)this + 0x100))(this,Array,4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::SetColor(float r, float g, float b, float a)
{
	dbg_assert(m_Drawing != 0, "called Graphics()->SetColor without begin");
	CColorVertex Array[4] = {
		CColorVertex(0, r, g, b, a),
		CColorVertex(1, r, g, b, a),
		CColorVertex(2, r, g, b, a),
		CColorVertex(3, r, g, b, a)};
	SetColorVertex(Array, 4);
}